

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> __thiscall
duckdb::TransactionInfo::Deserialize(TransactionInfo *this,Deserializer *deserializer)

{
  TransactionInfo *this_00;
  pointer pTVar1;
  _Head_base<0UL,_duckdb::TransactionInfo_*,_false> local_20;
  
  this_00 = (TransactionInfo *)operator_new(0x10);
  TransactionInfo(this_00);
  local_20._M_head_impl = this_00;
  pTVar1 = unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>,_true>::
           operator->((unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>,_true>
                       *)&local_20);
  Deserializer::ReadProperty<duckdb::TransactionType>
            (deserializer,200,"type",&(pTVar1->super_ParseInfo).field_0x9);
  pTVar1 = unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>,_true>::
           operator->((unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>,_true>
                       *)&local_20);
  Deserializer::ReadProperty<duckdb::TransactionModifierType>
            (deserializer,0xc9,"modifier",&(pTVar1->super_ParseInfo).field_0xa);
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)this;
}

Assistant:

unique_ptr<ParseInfo> TransactionInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<TransactionInfo>(new TransactionInfo());
	deserializer.ReadProperty<TransactionType>(200, "type", result->type);
	deserializer.ReadProperty<TransactionModifierType>(201, "modifier", result->modifier);
	return std::move(result);
}